

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O3

void mpp_writer_put_ue(MppWriteCtx *ctx,RK_U32 val)

{
  uint uVar1;
  uint len;
  uint val_00;
  uint uVar2;
  uint len_00;
  
  val_00 = val + 1;
  len = 0xffffffff;
  len_00 = 0xffffffff;
  do {
    uVar2 = len_00;
    len_00 = uVar2 + 1;
    len = len + 2;
  } while (val_00 >> ((char)uVar2 + 2U & 0x1f) != 0);
  uVar1 = uVar2 + 2;
  if (0xc < uVar1) {
    if (len_00 < 0x19) {
      mpp_writer_put_bits(ctx,0,len_00);
      len = uVar1;
      if (uVar1 < 0x19) goto LAB_00163a1e;
    }
    else {
      mpp_writer_put_bits(ctx,0,0x18);
      mpp_writer_put_bits(ctx,0,uVar2 - 0x17);
    }
    val_00 = val_00 >> ((byte)(uVar2 - 0x16) & 0x1f);
    mpp_writer_put_bits(ctx,val_00,0x18);
    len = uVar2 - 0x16;
  }
LAB_00163a1e:
  mpp_writer_put_bits(ctx,val_00,len);
  return;
}

Assistant:

void mpp_writer_put_ue(MppWriteCtx *ctx, RK_U32 val)
{
    RK_U32 num_bits = 0;

    val++;
    while (val >> ++num_bits);

    if (num_bits > 12) {
        RK_U32 tmp;

        tmp = num_bits - 1;

        if (tmp > 24) {
            tmp -= 24;
            mpp_writer_put_bits(ctx, 0, 24);
        }

        mpp_writer_put_bits(ctx, 0, tmp);

        if (num_bits > 24) {
            num_bits -= 24;
            mpp_writer_put_bits(ctx, val >> num_bits, 24);
            val = val >> num_bits;
        }

        mpp_writer_put_bits(ctx, val, num_bits);
    } else {
        mpp_writer_put_bits(ctx, val, 2 * num_bits - 1);
    }
}